

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::StartAgain(cmCTestRunTest *this)

{
  bool bVar1;
  cmWorkingDirectory workdir;
  cmWorkingDirectory local_30;
  
  bVar1 = this->RunAgain;
  if (bVar1 == true) {
    this->RunAgain = false;
    cmWorkingDirectory::cmWorkingDirectory(&local_30,&this->TestProperties->Directory);
    StartTest(this,this->TotalNumberOfTests);
    cmWorkingDirectory::~cmWorkingDirectory(&local_30);
  }
  return bVar1;
}

Assistant:

bool cmCTestRunTest::StartAgain()
{
  if (!this->RunAgain) {
    return false;
  }
  this->RunAgain = false; // reset
  // change to tests directory
  cmWorkingDirectory workdir(this->TestProperties->Directory);
  this->StartTest(this->TotalNumberOfTests);
  return true;
}